

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O1

pair<llvm::DenseMapIterator<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>,_false>,_bool>
* __thiscall
llvm::
DenseMapBase<llvm::DenseMap<unsigned_long,llvm::DWARFDebugNames::NameIndex_const*,llvm::DenseMapInfo<unsigned_long>,llvm::detail::DenseMapPair<unsigned_long,llvm::DWARFDebugNames::NameIndex_const*>>,unsigned_long,llvm::DWARFDebugNames::NameIndex_const*,llvm::DenseMapInfo<unsigned_long>,llvm::detail::DenseMapPair<unsigned_long,llvm::DWARFDebugNames::NameIndex_const*>>
::try_emplace<llvm::DWARFDebugNames::NameIndex_const*>
          (pair<llvm::DenseMapIterator<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>,_false>,_bool>
           *__return_storage_ptr__,void *this,unsigned_long *Key,NameIndex **Args)

{
  uint uVar1;
  long lVar2;
  bool bVar3;
  DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*> *in_RAX;
  DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*> *local_38;
  DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*> *ConstFoundBucket;
  
  local_38 = in_RAX;
  bVar3 = DenseMapBase<llvm::DenseMap<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>_>,_unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>_>
          ::LookupBucketFor<unsigned_long>
                    ((DenseMapBase<llvm::DenseMap<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>_>,_unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>_>
                      *)this,Key,&local_38);
  if (!bVar3) {
    local_38 = DenseMapBase<llvm::DenseMap<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>_>,_unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>_>
               ::InsertIntoBucketImpl<unsigned_long>
                         ((DenseMapBase<llvm::DenseMap<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>_>,_unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>_>
                           *)this,Key,Key,local_38);
    (local_38->super_pair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>).first = *Key;
    (local_38->super_pair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>).second = *Args;
  }
  uVar1 = *(uint *)((long)this + 0x10);
  lVar2 = *this;
  (__return_storage_ptr__->first).Ptr = local_38;
  (__return_storage_ptr__->first).End = (pointer)((ulong)uVar1 * 0x10 + lVar2);
  __return_storage_ptr__->second = !bVar3;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> try_emplace(KeyT &&Key, Ts &&... Args) {
    BucketT *TheBucket;
    if (LookupBucketFor(Key, TheBucket))
      return std::make_pair(
               makeIterator(TheBucket, getBucketsEnd(), *this, true),
               false); // Already in map.

    // Otherwise, insert the new element.
    TheBucket =
        InsertIntoBucket(TheBucket, std::move(Key), std::forward<Ts>(Args)...);
    return std::make_pair(
             makeIterator(TheBucket, getBucketsEnd(), *this, true),
             true);
  }